

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

StructuredAssignmentPatternSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StructuredAssignmentPatternSyntax,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,
          SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax> *args_1,Token *args_2)

{
  Token closeBrace;
  Token openBrace;
  StructuredAssignmentPatternSyntax *this_00;
  
  this_00 = (StructuredAssignmentPatternSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((StructuredAssignmentPatternSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (StructuredAssignmentPatternSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  openBrace.kind = args->kind;
  openBrace._2_1_ = args->field_0x2;
  openBrace.numFlags.raw = (args->numFlags).raw;
  openBrace.rawLen = args->rawLen;
  openBrace.info = args->info;
  closeBrace.kind = args_2->kind;
  closeBrace._2_1_ = args_2->field_0x2;
  closeBrace.numFlags.raw = (args_2->numFlags).raw;
  closeBrace.rawLen = args_2->rawLen;
  closeBrace.info = args_2->info;
  slang::syntax::StructuredAssignmentPatternSyntax::StructuredAssignmentPatternSyntax
            (this_00,openBrace,args_1,closeBrace);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }